

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTDMT_bufferPool * ZSTDMT_expandBufferPool(ZSTDMT_bufferPool *srcBufPool,U32 nbWorkers)

{
  size_t bSize_00;
  ZSTD_customMem cMem_00;
  ZSTDMT_bufferPool *newBufPool;
  size_t bSize;
  ZSTD_customMem cMem;
  uint maxNbBuffers;
  U32 nbWorkers_local;
  ZSTDMT_bufferPool *srcBufPool_local;
  
  if (srcBufPool == (ZSTDMT_bufferPool *)0x0) {
    srcBufPool_local = (ZSTDMT_bufferPool *)0x0;
  }
  else {
    srcBufPool_local = srcBufPool;
    if (srcBufPool->totalBuffers < nbWorkers * 2 + 3) {
      cMem_00 = srcBufPool->cMem;
      bSize_00 = srcBufPool->bufferSize;
      ZSTDMT_freeBufferPool(srcBufPool);
      srcBufPool_local = ZSTDMT_createBufferPool(nbWorkers,cMem_00);
      if (srcBufPool_local != (ZSTDMT_bufferPool *)0x0) {
        ZSTDMT_setBufferSize(srcBufPool_local,bSize_00);
      }
    }
  }
  return srcBufPool_local;
}

Assistant:

static ZSTDMT_bufferPool* ZSTDMT_expandBufferPool(ZSTDMT_bufferPool* srcBufPool, U32 nbWorkers)
{
    unsigned const maxNbBuffers = 2*nbWorkers + 3;
    if (srcBufPool==NULL) return NULL;
    if (srcBufPool->totalBuffers >= maxNbBuffers) /* good enough */
        return srcBufPool;
    /* need a larger buffer pool */
    {   ZSTD_customMem const cMem = srcBufPool->cMem;
        size_t const bSize = srcBufPool->bufferSize;   /* forward parameters */
        ZSTDMT_bufferPool* newBufPool;
        ZSTDMT_freeBufferPool(srcBufPool);
        newBufPool = ZSTDMT_createBufferPool(nbWorkers, cMem);
        if (newBufPool==NULL) return newBufPool;
        ZSTDMT_setBufferSize(newBufPool, bSize);
        return newBufPool;
    }
}